

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O1

bool __thiscall tinyusdz::Layer::check_unresolved_references(Layer *this,uint32_t max_depth)

{
  bool bVar1;
  bool bVar2;
  __node_base *p_Var3;
  
  p_Var3 = &(this->_prim_specs)._M_h._M_before_begin;
  bVar2 = false;
  do {
    p_Var3 = p_Var3->_M_nxt;
    if (p_Var3 == (__node_base *)0x0) goto LAB_00294536;
    bVar1 = anon_unknown_240::HasReferencesRec(0,(PrimSpec *)(p_Var3 + 5),max_depth);
  } while (!bVar1);
  bVar2 = true;
LAB_00294536:
  this->_has_unresolved_references = bVar2;
  return bVar2;
}

Assistant:

bool Layer::check_unresolved_references(const uint32_t max_depth) const {
  bool ret = false;

  for (const auto &item : _prim_specs) {
    if (HasReferencesRec(/* depth */ 0, item.second, max_depth)) {
      ret = true;
      break;
    }
  }

  _has_unresolved_references = ret;
  return _has_unresolved_references;
}